

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O1

bool __thiscall
NurseSolution::hasTurnConflict(NurseSolution *this,Turn *turnToCheck,Turn *turnToIgnore)

{
  Turn **ppTVar1;
  bool bVar2;
  __normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> __it;
  long lVar3;
  __normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> _Var4;
  Turn **local_48;
  Turn **local_40;
  Turn *local_38;
  Turn *local_30;
  
  local_40 = &local_30;
  local_48 = &local_38;
  __it._M_current =
       (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  ppTVar1 = (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar3 = (long)ppTVar1 - (long)__it._M_current >> 5;
  local_38 = turnToIgnore;
  local_30 = turnToCheck;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::$_0>::
              operator()((_Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::__0>
                          *)&local_48,__it);
      _Var4._M_current = __it._M_current;
      if (bVar2) goto LAB_0011244d;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::$_0>::
              operator()((_Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::__0>
                          *)&local_48,
                         (__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                          )(__it._M_current + 1));
      _Var4._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_0011244d;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::$_0>::
              operator()((_Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::__0>
                          *)&local_48,
                         (__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                          )(__it._M_current + 2));
      _Var4._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_0011244d;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::$_0>::
              operator()((_Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::__0>
                          *)&local_48,
                         (__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                          )(__it._M_current + 3));
      _Var4._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_0011244d;
      __it._M_current = __it._M_current + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)ppTVar1 - (long)__it._M_current >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var4._M_current = ppTVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::$_0>::
                  operator()((_Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::__0>
                              *)&local_48,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_0011244d;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::$_0>::
            operator()((_Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::__0>
                        *)&local_48,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_0011244d;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::$_0>::operator()
                    ((_Iter_pred<NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::__0>
                      *)&local_48,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = ppTVar1;
  }
LAB_0011244d:
  return _Var4._M_current != ppTVar1;
}

Assistant:

bool NurseSolution::hasTurnConflict(const Turn *turnToCheck, const Turn *turnToIgnore) const {
    return any_of(begin(turns), end(turns), [&](Turn* turnElem) -> bool {

        if (turnToIgnore != nullptr && turnElem->getId() == turnToIgnore->getId())
            return false;

        if (turnElem->getDay() == turnToCheck->getDay() - 1) {
            return turnElem->getShiftType()->isForbiddenShift(turnToCheck->getShiftType()->getId());
        } else if (turnElem->getDay() == turnToCheck->getDay() + 1) {
            return turnToCheck->getShiftType()->isForbiddenShift(turnElem->getShiftType()->getId());
        }

        return false;
    });
}